

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmPre.c
# Opt level: O1

word Ifd_ObjTruth(Ifd_Man_t *p,int iLit)

{
  ulong uVar1;
  word wVar2;
  int Counter;
  int local_c;
  
  uVar1 = (ulong)(uint)iLit;
  local_c = 0;
  if (iLit != 0) {
    if (iLit == 1) {
      uVar1 = 0xffffffffffffffff;
    }
    else {
      if (iLit < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf6,"int Abc_LitRegular(int)");
      }
      wVar2 = Ifd_ObjTruth_rec(p,iLit & 0x7ffffffe,&local_c);
      uVar1 = (long)(int)-(iLit & 1U) ^ wVar2;
    }
  }
  return uVar1;
}

Assistant:

word Ifd_ObjTruth( Ifd_Man_t * p, int iLit )
{
    word Fun;
    int Counter = 0;
    if ( iLit == 0 )
        return 0;
    if ( iLit == 1 )
        return ~(word)0;
    Fun = Ifd_ObjTruth_rec( p, Abc_LitRegular(iLit), &Counter );
    return Abc_LitIsCompl(iLit) ? ~Fun : Fun;
}